

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

QString * __thiscall QFontListView::text(QFontListView *this,int i)

{
  long lVar1;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  model((QFontListView *)0x79807b);
  QStringListModel::stringList();
  QList<QString>::at(in_RDI,(qsizetype)in_stack_ffffffffffffffa8);
  QString::QString((QString *)in_RDI,in_stack_ffffffffffffffa8);
  QList<QString>::~QList((QList<QString> *)0x7980b3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString text(int i) const {
        return model()->stringList().at(i);
    }